

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O2

char * duckdb_shell_sqlite3_column_decltype(sqlite3_stmt *pStmt,int iCol)

{
  pointer this;
  vector<duckdb::LogicalType,_true> *this_00;
  pointer pPVar1;
  const_reference other;
  char *pcVar2;
  value_type column_type;
  
  if (pStmt != (sqlite3_stmt *)0x0) {
    if ((pStmt->prepared).
        super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
        .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl ==
        (PreparedStatement *)0x0) {
      if ((pStmt->pending).
          super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
          .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl ==
          (PendingQueryResult *)0x0) {
        return (char *)0x0;
      }
      pPVar1 = duckdb::
               unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
               ::operator->(&pStmt->pending);
      this_00 = &(pPVar1->super_BaseQueryResult).types;
    }
    else {
      this = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->(&pStmt->prepared);
      this_00 = duckdb::PreparedStatement::GetTypes(this);
    }
    if ((-1 < iCol) &&
       ((ulong)(uint)iCol <
        (ulong)(((long)(this_00->
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18))) {
      other = duckdb::vector<duckdb::LogicalType,_true>::get<true>(this_00,(ulong)(uint)iCol);
      duckdb::LogicalType::LogicalType(&column_type,other);
      switch(column_type.id_) {
      case BOOLEAN:
        pcVar2 = "BOOLEAN";
        break;
      case TINYINT:
        pcVar2 = "TINYINT";
        break;
      case SMALLINT:
        pcVar2 = "SMALLINT";
        break;
      case INTEGER:
        pcVar2 = "INTEGER";
        break;
      case BIGINT:
        pcVar2 = "BIGINT";
        break;
      case DATE:
        pcVar2 = "DATE";
        break;
      case TIME:
        pcVar2 = "TIME";
        break;
      case TIMESTAMP_SEC:
      case TIMESTAMP_MS:
      case TIMESTAMP:
      case TIMESTAMP_NS:
        pcVar2 = "TIMESTAMP";
        break;
      case DECIMAL:
        pcVar2 = "DECIMAL";
        break;
      case FLOAT:
        pcVar2 = "FLOAT";
        break;
      case DOUBLE:
        pcVar2 = "DOUBLE";
        break;
      case VARCHAR:
        pcVar2 = "VARCHAR";
        break;
      case BLOB:
        pcVar2 = "BLOB";
        break;
      default:
        if (column_type.id_ == STRUCT) {
          pcVar2 = "STRUCT";
          break;
        }
        if (column_type.id_ == LIST) {
          pcVar2 = "LIST";
          break;
        }
        if (column_type.id_ == MAP) {
          pcVar2 = "MAP";
          break;
        }
      case CHAR:
        pcVar2 = (char *)0x0;
      }
      duckdb::LogicalType::~LogicalType(&column_type);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *sqlite3_column_decltype(sqlite3_stmt *pStmt, int iCol) {
	if (!pStmt) {
		return nullptr;
	}

	const duckdb::vector<LogicalType> *types;
	if (pStmt->prepared) {
		types = &pStmt->prepared->GetTypes();
	} else if (pStmt->pending) {
		types = &pStmt->pending->types;
	} else {
		return nullptr;
	}
	if (iCol < 0 || types->size() <= static_cast<size_t>(iCol)) {
		return nullptr;
	}

	auto column_type = (*types)[iCol];
	switch (column_type.id()) {
	case LogicalTypeId::BOOLEAN:
		return "BOOLEAN";
	case LogicalTypeId::TINYINT:
		return "TINYINT";
	case LogicalTypeId::SMALLINT:
		return "SMALLINT";
	case LogicalTypeId::INTEGER:
		return "INTEGER";
	case LogicalTypeId::BIGINT:
		return "BIGINT";
	case LogicalTypeId::FLOAT:
		return "FLOAT";
	case LogicalTypeId::DOUBLE:
		return "DOUBLE";
	case LogicalTypeId::DECIMAL:
		return "DECIMAL";
	case LogicalTypeId::DATE:
		return "DATE";
	case LogicalTypeId::TIME:
		return "TIME";
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_NS:
	case LogicalTypeId::TIMESTAMP_MS:
	case LogicalTypeId::TIMESTAMP_SEC:
		return "TIMESTAMP";
	case LogicalTypeId::VARCHAR:
		return "VARCHAR";
	case LogicalTypeId::LIST:
		return "LIST";
	case LogicalTypeId::MAP:
		return "MAP";
	case LogicalTypeId::STRUCT:
		return "STRUCT";
	case LogicalTypeId::BLOB:
		return "BLOB";
	default:
		return NULL;
	}
	return NULL;
}